

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xform.cpp
# Opt level: O3

bool __thiscall ON_Xform::DecomposeSymmetric(ON_Xform *this,ON_Xform *Q,ON_3dVector *diagonal)

{
  double *pdVar1;
  double dVar2;
  double F;
  double E;
  bool bVar3;
  long lVar4;
  ON_Xform *pOVar5;
  byte bVar6;
  ON_3dVector evec [3];
  ON_3dVector OStack_f8;
  ON_3dVector local_e0;
  ON_3dVector local_c8;
  ON_Xform local_a8;
  
  bVar6 = 0;
  bVar3 = IsAffine(this);
  if (((((bVar3) && (dVar2 = this->m_xform[0][3], dVar2 == 0.0)) && (!NAN(dVar2))) &&
      ((dVar2 = this->m_xform[1][3], dVar2 == 0.0 && (!NAN(dVar2))))) &&
     ((dVar2 = this->m_xform[2][3], dVar2 == 0.0 && (!NAN(dVar2))))) {
    dVar2 = this->m_xform[0][1];
    if ((dVar2 == this->m_xform[1][0]) && (!NAN(dVar2) && !NAN(this->m_xform[1][0]))) {
      F = this->m_xform[0][2];
      if ((F == this->m_xform[2][0]) && (!NAN(F) && !NAN(this->m_xform[2][0]))) {
        E = this->m_xform[1][2];
        pdVar1 = this->m_xform[2] + 1;
        if ((E == *pdVar1) && (!NAN(E) && !NAN(*pdVar1))) {
          bVar3 = ON_Sym3x3EigenSolver
                            (this->m_xform[0][0],this->m_xform[1][1],this->m_xform[2][2],dVar2,E,F,
                             &diagonal->x,&OStack_f8,&diagonal->y,&local_e0,&diagonal->z,&local_c8);
          if (bVar3) {
            ON_Xform(&local_a8,&ON_3dPoint::Origin,&OStack_f8,&local_e0,&local_c8);
            pOVar5 = &local_a8;
            for (lVar4 = 0x10; lVar4 != 0; lVar4 = lVar4 + -1) {
              Q->m_xform[0][0] = pOVar5->m_xform[0][0];
              pOVar5 = (ON_Xform *)((long)pOVar5 + ((ulong)bVar6 * -2 + 1) * 8);
              Q = (ON_Xform *)((long)Q + ((ulong)bVar6 * -2 + 1) * 8);
            }
            return bVar3;
          }
          return bVar3;
        }
      }
    }
  }
  return false;
}

Assistant:

bool ON_Xform::DecomposeSymmetric(ON_Xform& Q, ON_3dVector& diagonal) const
{
	bool rc = false;
	if (IsLinear())
	{
		bool symmetric  = ( m_xform[0][1] == m_xform[1][0] && 
			m_xform[0][2] == m_xform[2][0] && 
			m_xform[1][2] == m_xform[2][1]  );
		if (symmetric)
		{
			ON_3dVector evec[3];
			rc = ON_Sym3x3EigenSolver(m_xform[0][0], m_xform[1][1], m_xform[2][2],
				m_xform[0][1], m_xform[1][2], m_xform[0][2],
				&diagonal.x, evec[0],
				&diagonal.y, evec[1],
				&diagonal.z, evec[2]);
			if (rc)
			{
				Q = ON_Xform(ON_3dPoint::Origin, evec[0], evec[1], evec[2]);
			}
		}
	}
	return rc;
}